

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

int Gla_ManGetOutLit(Gla_Man_t *p,int f)

{
  int iVar1;
  Gla_Obj_t *pGVar2;
  int iVar3;
  Gla_Obj_t *pGVar4;
  
  pGVar2 = p->pObjRoot;
  iVar1 = pGVar2->Fanins[0];
  if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                  ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
  }
  if (iVar1 == 0) {
    pGVar4 = (Gla_Obj_t *)0x0;
  }
  else {
    pGVar4 = p->pObjs + iVar1;
  }
  if ((-1 < f) && (f < (pGVar4->vFrames).nSize)) {
    iVar1 = (pGVar4->vFrames).pArray[(uint)f];
    if (0 < iVar1) {
      if (((f != 0) || ((pGVar4->field_0x4 & 0x20) == 0)) ||
         (iVar3 = -1, (pGVar2->field_0x4 & 2) != 0)) {
        iVar3 = (*(uint *)&pGVar2->field_0x4 >> 1 & 1) + iVar1 * 2;
      }
      return iVar3;
    }
    __assert_fail("iSat > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                  ,0x5a0,"int Gla_ManGetOutLit(Gla_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gla_ManGetOutLit( Gla_Man_t * p, int f )
{
    Gla_Obj_t * pFanin = Gla_ManObj( p, p->pObjRoot->Fanins[0] );
    int iSat = Vec_IntEntry( &pFanin->vFrames, f );
    assert( iSat > 0 );
    if ( f == 0 && pFanin->fRo && !p->pObjRoot->fCompl0 )
        return -1;
    return Abc_Var2Lit( iSat, p->pObjRoot->fCompl0 );
}